

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

void * block_eval(Env *env,BlockStmt *stmt)

{
  List *list;
  undefined8 *puVar1;
  int i;
  uint index;
  
  list = stmt->stmts;
  for (index = 0; index < list->size; index = index + 1) {
    puVar1 = (undefined8 *)list_get(list,index);
    if (puVar1 != (undefined8 *)0x0) {
      (*(code *)*puVar1)(env,puVar1);
    }
  }
  return (void *)0x0;
}

Assistant:

void *block_eval(Env *env, BlockStmt *stmt) {
    void* elem;
    List* list = stmt->stmts;
    for (int i = 0; i < list->size; ++i) {
        elem = list_get(list, i);
        if (elem == NULL)continue;
        tree_node(elem)->eval(env, elem);
    }
    return NULL;
}